

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O1

void __thiscall UniValue::writeArray(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  std::__cxx11::string::append((char *)s);
  if (prettyIndent != 0) {
    std::__cxx11::string::append((char *)s);
  }
  if ((this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      if ((indentLevel | prettyIndent) < 0x100 && prettyIndent != 0) {
        std::__cxx11::string::_M_replace_aux
                  ((ulong)s,s->_M_string_length,0,(char)indentLevel * (char)prettyIndent);
      }
      write_abi_cxx11_((UniValue *)local_50,
                       (int)uVar3 * 0x58 +
                       (int)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                            _M_impl.super__Vector_impl_data._M_start,(void *)(ulong)prettyIndent,
                       (ulong)(indentLevel + 1));
      std::__cxx11::string::_M_append((char *)s,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U != uVar3) {
        std::__cxx11::string::append((char *)s);
      }
      if (prettyIndent != 0) {
        std::__cxx11::string::append((char *)s);
      }
      uVar3 = (ulong)uVar2;
      uVar1 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3;
      uVar2 = uVar2 + 1;
    } while (uVar3 <= uVar1 && uVar1 - uVar3 != 0);
  }
  if ((prettyIndent != 0) && ((indentLevel - 1 | prettyIndent) < 0x100)) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)s,s->_M_string_length,0,(char)(indentLevel - 1) * (char)prettyIndent);
  }
  std::__cxx11::string::append((char *)s);
  return;
}

Assistant:

void UniValue::writeArray(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "[";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < values.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += values[i].write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1)) {
            s += ",";
        }
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "]";
}